

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_object(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,json_visitor *visitor,error_code *ec)

{
  bool bVar1;
  char_result<unsigned_char> cVar2;
  int iVar3;
  type_conflict2 tVar4;
  uchar *__args_2;
  uchar *puVar5;
  unsigned_long *__args_1;
  unsigned_long *puVar6;
  int iVar7;
  error_code *in_RDX;
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RDI;
  size_t length_1;
  size_t length;
  uint8_t b;
  char_result<unsigned_char> c;
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff98;
  ser_context *in_stack_ffffffffffffffa0;
  semantic_tag tag;
  parse_mode *in_stack_ffffffffffffffa8;
  ubjson_errc __e;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe3;
  undefined1 in_stack_ffffffffffffffe5;
  uchar uVar8;
  undefined1 uVar9;
  
  iVar7 = *(int *)((long)&(in_RDI->end_)._M_current + 4) + 1;
  *(int *)((long)&(in_RDI->end_)._M_current + 4) = iVar7;
  iVar3 = ubjson_options_common::max_nesting_depth
                    ((ubjson_options_common *)
                     ((long)&in_RDI[1].buffer_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                     *(long *)(in_RDI[1].buffer_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + -0x18)));
  if (iVar3 < iVar7) {
    std::error_code::operator=
              ((error_code *)in_RDI,(ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    *(undefined1 *)&(in_RDI->end_)._M_current = 0;
  }
  else {
    cVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::peek(in_stack_ffffffffffffff98);
    uVar8 = cVar2.value;
    uVar9 = cVar2.eof;
    if (((ushort)cVar2 & 0x100) == 0) {
      if (uVar8 == '$') {
        binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::ignore(in_RDI,(size_t)in_stack_ffffffffffffffa8);
        tag = (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
        tVar4 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::read<std::random_access_iterator_tag>
                          ((binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(in_stack_ffffffffffffffe5,
                                                                     CONCAT23(
                                                  in_stack_ffffffffffffffe3,
                                                  in_stack_ffffffffffffffe0)))),
                           (value_type *)in_stack_ffffffffffffffd8,
                           CONCAT44(in_stack_ffffffffffffffd4,
                                    CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
        if (tVar4 == 0) {
          std::error_code::operator=
                    ((error_code *)in_RDI,(ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        }
        else {
          cVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::peek(in_stack_ffffffffffffff98);
          __e = (ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
          if (((ushort)cVar2 & 0x100) == 0) {
            if (cVar2.value == '#') {
              binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::ignore(in_RDI,(size_t)in_stack_ffffffffffffffa8);
              __args_2 = (uchar *)get_length(in_stack_ffffffffffffffd8,
                                             (error_code *)
                                             CONCAT44(in_stack_ffffffffffffffd4,
                                                      CONCAT22(in_stack_ffffffffffffffd2,
                                                               in_stack_ffffffffffffffd0)));
              bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
              if (!bVar1) {
                puVar5 = (uchar *)ubjson_decode_options::max_items
                                            ((ubjson_decode_options *)&in_RDI[1].buffer_);
                if (puVar5 < __args_2) {
                  std::error_code::operator=
                            ((error_code *)in_RDI,(ubjson_errc)((ulong)__args_2 >> 0x20));
                  *(undefined1 *)&(in_RDI->end_)._M_current = 0;
                }
                else {
                  std::
                  vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                  ::emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&,unsigned_char&>
                            ((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                              *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (parse_mode *)CONCAT44(in_stack_ffffffffffffffbc,iVar7),
                             (unsigned_long *)in_RDI,__args_2);
                  basic_json_visitor<char>::begin_object
                            ((basic_json_visitor<char> *)in_RDI,(size_t)__args_2,tag,
                             (ser_context *)in_stack_ffffffffffffff98,(error_code *)0xde4b95);
                  *(byte *)&(in_RDI->end_)._M_current = ((byte)in_RDI->position_ ^ 0xff) & 1;
                }
              }
            }
            else {
              std::error_code::operator=((error_code *)in_RDI,__e);
              *(undefined1 *)&(in_RDI->end_)._M_current = 0;
            }
          }
          else {
            std::error_code::operator=((error_code *)in_RDI,__e);
            *(undefined1 *)&(in_RDI->end_)._M_current = 0;
          }
        }
      }
      else {
        cVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::peek(in_stack_ffffffffffffff98);
        if (((ushort)cVar2 & 0x100) == 0) {
          if (cVar2.value == '#') {
            binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::ignore(in_RDI,(size_t)in_stack_ffffffffffffffa8);
            __args_1 = (unsigned_long *)
                       get_length(in_stack_ffffffffffffffd8,
                                  (error_code *)
                                  CONCAT44(in_stack_ffffffffffffffd4,
                                           CONCAT22(cVar2,in_stack_ffffffffffffffd0)));
            bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
            if (!bVar1) {
              puVar6 = (unsigned_long *)
                       ubjson_decode_options::max_items((ubjson_decode_options *)&in_RDI[1].buffer_)
              ;
              if (puVar6 < __args_1) {
                std::error_code::operator=
                          ((error_code *)in_RDI,
                           (ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                *(undefined1 *)&(in_RDI->end_)._M_current = 0;
              }
              else {
                std::
                vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
                ::emplace_back<jsoncons::ubjson::parse_mode,unsigned_long&>
                          ((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                            *)in_RDI,in_stack_ffffffffffffffa8,__args_1);
                basic_json_visitor<char>::begin_object
                          ((basic_json_visitor<char> *)in_RDI,(size_t)in_stack_ffffffffffffffa8,
                           (semantic_tag)((ulong)__args_1 >> 0x38),
                           (ser_context *)in_stack_ffffffffffffff98,(error_code *)0xde4ce0);
                *(byte *)&(in_RDI->end_)._M_current = ((byte)in_RDI->position_ ^ 0xff) & 1;
              }
            }
          }
          else {
            std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>
            ::emplace_back<jsoncons::ubjson::parse_mode,int>
                      ((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                        *)in_RDI,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
            basic_json_visitor<char>::begin_object
                      ((basic_json_visitor<char> *)in_RDI,
                       (semantic_tag)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                       in_stack_ffffffffffffffa0,(error_code *)in_stack_ffffffffffffff98);
            *(byte *)&(in_RDI->end_)._M_current = ((byte)in_RDI->position_ ^ 0xff) & 1;
          }
        }
        else {
          std::error_code::operator=
                    ((error_code *)in_RDI,(ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          *(undefined1 *)&(in_RDI->end_)._M_current = 0;
        }
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)in_RDI,(ubjson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      *(undefined1 *)&(in_RDI->end_)._M_current = 0;
    }
  }
  return;
}

Assistant:

void begin_object(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        if (c.value == jsoncons::ubjson::ubjson_type::type_marker)
        {
            source_.ignore(1);
            uint8_t b;
            if (source_.read(&b, 1) == 0)
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::strongly_typed_map_key,length,b);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                ec = ubjson_errc::count_required_after_type;
                more_ = false;
                return;
            }
        }
        else
        {
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = ubjson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c.value == jsoncons::ubjson::ubjson_type::count_marker)
            {
                source_.ignore(1);
                std::size_t length = get_length(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (length > options_.max_items())
                {
                    ec = ubjson_errc::max_items_exceeded;
                    more_ = false;
                    return;
                }
                state_stack_.emplace_back(parse_mode::map_key,length);
                visitor.begin_object(length, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
            else
            {
                state_stack_.emplace_back(parse_mode::indefinite_map_key,0);
                visitor.begin_object(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
            }
        }
    }